

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::identificador(Sintatico *this)

{
  bool bVar1;
  bool local_55;
  allocator<char> local_31;
  string local_30;
  Sintatico *local_10;
  Sintatico *this_local;
  
  local_10 = this;
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
  if (bVar1) {
    do {
      if (this->tok == 2) {
        eat(this,2);
      }
      else if (this->tok == 3) {
        eat(this,3);
      }
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
      local_55 = true;
      if (!bVar1) {
        local_55 = Tokens::isEqual((Tokens *)this,this->tok,3);
      }
    } while (local_55 != false);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ID valid",&local_31);
  error(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  exit(0);
}

Assistant:

void Sintatico::identificador() {
  if (Lexico::isEqual(tok, LETRA)) {
    do {
      switch (tok) {
        case DIGITO: eat(DIGITO); break;
        case LETRA : eat(LETRA) ; break;
      }
    } while (Lexico::isEqual(tok, LETRA) || Lexico::isEqual(tok, DIGITO));
  }
  else {
    error("ID valid");
    exit(0);
  }
}